

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetChaseThreshold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e3107;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e30f7:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3107:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1956,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003e304e;
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e3107;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003e30f7;
LAB_003e304e:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_003e312f:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1957,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e312f;
  }
  iVar2 = param[1].field_0.i;
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e3157;
    }
    bVar7 = param[2].field_0.i == 0;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003e3157:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1958,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar7 = param[2].field_0.i == 0;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003e30ba;
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e3176;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003e30ba:
    pAVar4 = COPY_AAPTR(pAVar4,param[3].field_0.i);
    if (pAVar4 != (AActor *)0x0) {
      iVar5 = 0;
      if (0 < iVar2) {
        iVar5 = iVar2;
      }
      if (bVar7) {
        pAVar4->threshold = iVar5;
      }
      else {
        pAVar4->DefThreshold = iVar5;
      }
    }
    return 0;
  }
  pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e3176:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1959,
                "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetChaseThreshold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(threshold);
	PARAM_BOOL_DEF(def);
	PARAM_INT_DEF(ptr);


	AActor *mobj = COPY_AAPTR(self, ptr);
	if (!mobj)
	{
		return 0;
	}
	if (def)
		mobj->DefThreshold = (threshold >= 0) ? threshold : 0;
	else
		mobj->threshold = (threshold >= 0) ? threshold : 0;
	return 0;
}